

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOstreamBuffer.cpp
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_397711::TestcaseBase::toString<long_double>
          (string *__return_storage_ptr__,TestcaseBase *this,longdouble t)

{
  string *psVar1;
  
  binlog::detail::OstreamBuffer::operator<<(&this->buf,t);
  binlog::detail::OstreamBuffer::flush(&this->buf);
  std::__cxx11::stringbuf::str();
  psVar1 = (string *)std::__cxx11::stringbuf::str((string *)&this->field_0x8);
  return psVar1;
}

Assistant:

std::string toString(T t)
  {
    buf << t;
    std::string s = result();
    str.str({}); // clear ostream
    return s;
  }